

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void CreateDefaultConstructorCode
               (ExpressionContext *ctx,SynBase *source,TypeClass *classType,
               IntrusiveList<ExprBase> *expressions)

{
  long lVar1;
  ScopeData *source_00;
  ExprBase *pEVar2;
  MemberHandle *pMVar3;
  SynBase *pSVar4;
  bool bVar5;
  TypeRef *type;
  ExprTypeLiteral *this;
  ExprBase *pEVar6;
  TypeArray *pTVar7;
  ExprArraySetup *this_00;
  ExprZeroInitialize *this_01;
  TypeClass *local_f0;
  bool local_da;
  byte local_d9;
  ExprBase *call_1;
  TypeArray *arrType;
  ExprBase *initializer;
  ExprBase *call;
  ExprBase *cast;
  IntrusiveList<SynIdentifier> local_a0;
  ExprBase *local_90;
  ExprBase *thisAccess;
  ExprBase *local_78;
  ExprBase *member;
  ExprBase *access;
  SynBase *memberSource;
  long local_50;
  MemberHandle *baseMember;
  ExprBase *pEStack_40;
  bool found;
  TypeClass *base;
  VariableData *variable;
  MemberHandle *el;
  IntrusiveList<ExprBase> *expressions_local;
  TypeClass *classType_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  variable = (VariableData *)(classType->super_TypeStruct).members.head;
  el = (MemberHandle *)expressions;
  expressions_local = (IntrusiveList<ExprBase> *)classType;
  classType_local = (TypeClass *)source;
  source_local = (SynBase *)ctx;
  do {
    if (variable == (VariableData *)0x0) {
      return;
    }
    base = (TypeClass *)variable->importModule;
    pEStack_40 = expressions_local[0x11].tail;
    if (pEStack_40 == (ExprBase *)0x0) {
LAB_00255f6c:
      if (variable->source == (SynBase *)0x0) {
        local_f0 = classType_local;
      }
      else {
        local_f0 = (TypeClass *)variable->source;
      }
      access = (ExprBase *)local_f0;
      member = CreateVariableAccess
                         ((ExpressionContext *)source_local,(SynBase *)local_f0,(VariableData *)base
                          ,true);
      local_78 = CreateGetAddress((ExpressionContext *)source_local,(SynBase *)classType_local,
                                  member);
      lVar1 = *(long *)&(base->super_TypeStruct).super_TypeBase.typeIndex;
      InplaceStr::InplaceStr((InplaceStr *)&thisAccess,"$typeid");
      bVar5 = InplaceStr::operator==((InplaceStr *)(lVar1 + 0x40),(InplaceStr *)&thisAccess);
      pSVar4 = source_local;
      if (bVar5) {
        if (expressions_local[0x11].tail != (ExprBase *)0x0) {
          bVar5 = HasDefaultConstructor
                            ((ExpressionContext *)source_local,(SynBase *)access,
                             (TypeBase *)expressions_local[0x11].tail);
          pSVar4 = source_local;
          pEVar6 = access;
          if (!bVar5) {
            __assert_fail("HasDefaultConstructor(ctx, memberSource, classType->baseClass)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x2783,
                          "void CreateDefaultConstructorCode(ExpressionContext &, SynBase *, TypeClass *, IntrusiveList<ExprBase> &)"
                         );
          }
          IntrusiveList<SynIdentifier>::IntrusiveList(&local_a0);
          InplaceStr::InplaceStr((InplaceStr *)&cast,"this");
          local_90 = CreateVariableAccess
                               ((ExpressionContext *)pSVar4,(SynBase *)pEVar6,local_a0,_cast,false);
          if (local_90 == (ExprBase *)0x0) {
            anon_unknown.dwarf_e7629::Stop
                      ((ExpressionContext *)source_local,(SynBase *)access,
                       "ERROR: \'this\' variable is not available");
          }
          pSVar4 = source_local;
          pEVar2 = access;
          pEVar6 = local_90;
          type = ExpressionContext::GetReferenceType
                           ((ExpressionContext *)source_local,
                            (TypeBase *)expressions_local[0x11].tail);
          pEVar6 = CreateCast((ExpressionContext *)pSVar4,(SynBase *)pEVar2,pEVar6,
                              &type->super_TypeBase,true);
          pEVar6 = CreateDefaultConstructorCall
                             ((ExpressionContext *)source_local,(SynBase *)access,
                              (TypeBase *)expressions_local[0x11].tail,pEVar6);
          if (pEVar6 != (ExprBase *)0x0) {
            IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)el,pEVar6);
          }
        }
        pSVar4 = source_local;
        pMVar3 = el;
        pEVar2 = access;
        pEVar6 = local_78;
        this = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
        ExprTypeLiteral::ExprTypeLiteral
                  (this,(SynBase *)access,*(TypeBase **)&source_local[0x227].listed,
                   (TypeBase *)expressions_local);
        pEVar6 = CreateAssignment((ExpressionContext *)pSVar4,(SynBase *)pEVar2,pEVar6,
                                  &this->super_ExprBase);
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)pMVar3,pEVar6);
      }
      else if (variable->scope == (ScopeData *)0x0) {
        bVar5 = HasDefaultConstructor
                          ((ExpressionContext *)source_local,(SynBase *)access,
                           (TypeBase *)(base->super_TypeStruct).super_TypeBase.importModule);
        pMVar3 = el;
        if (bVar5) {
          pEVar6 = CreateDefaultConstructorCall
                             ((ExpressionContext *)source_local,(SynBase *)access,
                              (TypeBase *)(base->super_TypeStruct).super_TypeBase.importModule,
                              local_78);
          if (pEVar6 != (ExprBase *)0x0) {
            IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)el,pEVar6);
          }
        }
        else {
          this_01 = ExpressionContext::get<ExprZeroInitialize>((ExpressionContext *)source_local);
          ExprZeroInitialize::ExprZeroInitialize
                    (this_01,(SynBase *)access,*(TypeBase **)&source_local[0x226].listed,local_78);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)pMVar3,&this_01->super_ExprBase);
        }
      }
      else {
        source_00 = variable->scope;
        pEVar6 = AnalyzeExpression((ExpressionContext *)source_local,(SynBase *)variable->scope);
        pEVar6 = ResolveInitializerValue((ExpressionContext *)pSVar4,(SynBase *)source_00,pEVar6);
        pTVar7 = getType<TypeArray>((TypeBase *)(base->super_TypeStruct).super_TypeBase.importModule
                                   );
        if ((((pTVar7 == (TypeArray *)0x0) || (bVar5 = isType<TypeArray>(pEVar6->type), bVar5)) ||
            (pEVar6->type == (TypeBase *)source_local[0x228].pos.end)) ||
           (pEVar6->type == (TypeBase *)source_local[0x228].pos.begin)) {
          pMVar3 = el;
          pEVar6 = CreateAssignment((ExpressionContext *)source_local,pEVar6->source,member,pEVar6);
          IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)pMVar3,pEVar6);
        }
        else {
          pEVar6 = CreateCast((ExpressionContext *)source_local,pEVar6->source,pEVar6,
                              pTVar7->subType,false);
          pMVar3 = el;
          this_00 = ExpressionContext::get<ExprArraySetup>((ExpressionContext *)source_local);
          ExprArraySetup::ExprArraySetup
                    (this_00,pEVar6->source,*(TypeBase **)&source_local[0x226].listed,local_78,
                     pEVar6);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)pMVar3,&this_00->super_ExprBase);
        }
      }
    }
    else {
      baseMember._7_1_ = false;
      local_50 = *(long *)&pEStack_40[2].typeID;
      while( true ) {
        local_d9 = 0;
        if (local_50 != 0) {
          local_d9 = baseMember._7_1_ ^ 0xff;
        }
        if ((local_d9 & 1) == 0) break;
        baseMember._7_1_ =
             InplaceStr::operator==
                       ((InplaceStr *)
                        (*(long *)&(base->super_TypeStruct).super_TypeBase.typeIndex + 0x40),
                        (InplaceStr *)(*(long *)(*(long *)(local_50 + 8) + 0x28) + 0x40));
        local_50 = *(long *)(local_50 + 0x18);
      }
      local_da = false;
      if ((bool)baseMember._7_1_ != false) {
        lVar1 = *(long *)&(base->super_TypeStruct).super_TypeBase.typeIndex;
        InplaceStr::InplaceStr((InplaceStr *)&memberSource,"$typeid");
        local_da = InplaceStr::operator!=((InplaceStr *)(lVar1 + 0x40),(InplaceStr *)&memberSource);
      }
      if (local_da == false) goto LAB_00255f6c;
    }
    variable = *(VariableData **)&variable->alignment;
  } while( true );
}

Assistant:

void CreateDefaultConstructorCode(ExpressionContext &ctx, SynBase *source, TypeClass *classType, IntrusiveList<ExprBase> &expressions)
{
	for(MemberHandle *el = classType->members.head; el; el = el->next)
	{
		VariableData *variable = el->variable;

		if(TypeClass *base = classType->baseClass)
		{
			bool found = false;

			for(MemberHandle *baseMember = base->members.head; baseMember && !found; baseMember = baseMember->next)
				found = variable->name->name == baseMember->variable->name->name;

			if(found && variable->name->name != InplaceStr("$typeid"))
				continue;
		}

		SynBase *memberSource = el->source ? el->source : source;

		ExprBase *access = CreateVariableAccess(ctx, memberSource, variable, true);

		ExprBase *member = CreateGetAddress(ctx, source, access);

		if(variable->name->name == InplaceStr("$typeid"))
		{
			if(classType->baseClass)
			{
				assert(HasDefaultConstructor(ctx, memberSource, classType->baseClass));

				ExprBase *thisAccess = CreateVariableAccess(ctx, memberSource, IntrusiveList<SynIdentifier>(), InplaceStr("this"), false);

				if(!thisAccess)
					Stop(ctx, memberSource, "ERROR: 'this' variable is not available");

				ExprBase *cast = CreateCast(ctx, memberSource, thisAccess, ctx.GetReferenceType(classType->baseClass), true);

				if(ExprBase *call = CreateDefaultConstructorCall(ctx, memberSource, classType->baseClass, cast))
					expressions.push_back(call);
			}

			expressions.push_back(CreateAssignment(ctx, memberSource, member, new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(memberSource, ctx.typeTypeID, classType)));
			continue;
		}

		if(el->initializer)
		{
			ExprBase *initializer = ResolveInitializerValue(ctx, el->initializer, AnalyzeExpression(ctx, el->initializer));

			TypeArray *arrType = getType<TypeArray>(variable->type);

			// Single-level array might be set with a single element at the point of definition
			if(arrType && !isType<TypeArray>(initializer->type) && initializer->type != ctx.typeAutoArray && initializer->type != ctx.typeAutoRef)
			{
				initializer = CreateCast(ctx, initializer->source, initializer, arrType->subType, false);

				expressions.push_back(new (ctx.get<ExprArraySetup>()) ExprArraySetup(initializer->source, ctx.typeVoid, member, initializer));
			}
			else
			{
				expressions.push_back(CreateAssignment(ctx, initializer->source, access, initializer));
			}
		}
		else if(HasDefaultConstructor(ctx, memberSource, variable->type))
		{
			if(ExprBase *call = CreateDefaultConstructorCall(ctx, memberSource, variable->type, member))
				expressions.push_back(call);
		}
		else
		{
			expressions.push_back(new (ctx.get<ExprZeroInitialize>()) ExprZeroInitialize(memberSource, ctx.typeVoid, member));
		}
	}
}